

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Type *pTVar1;
  int iVar2;
  long in_RDI;
  Type *result;
  
  iVar2 = *(int *)(in_RDI + 8) + -1;
  *(int *)(in_RDI + 8) = iVar2;
  pTVar1 = cast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)iVar2 * 8));
  **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + -1;
  if (*(int *)(in_RDI + 8) < **(int **)(in_RDI + 0x10)) {
    *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8 + (long)*(int *)(in_RDI + 8) * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8 + (long)**(int **)(in_RDI + 0x10) * 8);
  }
  return pTVar1;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::UnsafeArenaReleaseLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  typename TypeHandler::Type* result =
      cast<TypeHandler>(rep_->elements[--current_size_]);
  --rep_->allocated_size;
  if (current_size_ < rep_->allocated_size) {
    // There are cleared elements on the end; replace the removed element
    // with the last allocated element.
    rep_->elements[current_size_] = rep_->elements[rep_->allocated_size];
  }
  return result;
}